

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

wchar_t __thiscall CharConvUCS2::readch(CharConvUCS2 *this,CVmDataSource *src)

{
  int iVar1;
  wchar_t wVar2;
  uchar buf [2];
  
  iVar1 = (*src->_vptr_CVmDataSource[2])(src,buf,2);
  if (iVar1 == 0) {
    wVar2 = (**(code **)(*(long *)this + 0x48))(this,buf);
    return wVar2;
  }
  err_throw(0x65);
}

Assistant:

virtual wchar_t readch(CVmDataSource *src)
    {
        /* read a two-byte character into our buffer */
        unsigned char buf[2];
        if (src->read(buf, 2))
            err_throw(VMERR_READ_FILE);

        /* return the character */
        return file_to_machine(buf);
    }